

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O2

void SplitVarnode::createBinaryOp
               (Funcdata *data,SplitVarnode *out,SplitVarnode *in1,SplitVarnode *in2,
               PcodeOp *existop,OpCode opc)

{
  PcodeOp *op;
  
  findCreateOutputWhole(out,data);
  findCreateWhole(in1,data);
  findCreateWhole(in2,data);
  if (existop->opcode->opcode == CPUI_PIECE) {
    Funcdata::opSetOpcode(data,existop,opc);
    Funcdata::opSetInput(data,existop,in1->whole,0);
    Funcdata::opSetInput(data,existop,in2->whole,1);
    return;
  }
  op = Funcdata::newOp(data,2,&(existop->start).pc);
  Funcdata::opSetOpcode(data,op,opc);
  Funcdata::opSetOutput(data,op,out->whole);
  Funcdata::opSetInput(data,op,in1->whole,0);
  Funcdata::opSetInput(data,op,in2->whole,1);
  Funcdata::opInsertBefore(data,op,existop);
  buildLoFromWhole(out,data);
  buildHiFromWhole(out,data);
  return;
}

Assistant:

void SplitVarnode::createBinaryOp(Funcdata &data,SplitVarnode &out,SplitVarnode &in1,SplitVarnode &in2,
				  PcodeOp *existop,OpCode opc)

{ // Rewrite the double precision operation (if possible) by replacing the pieces with unified varnodes
  // Make sure all the actual whole varnodes exist
  out.findCreateOutputWhole(data);
  in1.findCreateWhole(data);
  in2.findCreateWhole(data);
  if (existop->code() != CPUI_PIECE) { // If the output whole didn't previously exist
    PcodeOp *newop = data.newOp(2,existop->getAddr()); // new op which creates the output whole
    data.opSetOpcode(newop,opc);
    data.opSetOutput(newop,out.getWhole());
    data.opSetInput(newop,in1.getWhole(),0);
    data.opSetInput(newop,in2.getWhole(),1);
    data.opInsertBefore(newop,existop);
    out.buildLoFromWhole(data);
    out.buildHiFromWhole(data);
  }
  else {			// The whole previously existed
    data.opSetOpcode(existop,opc); // our new op replaces the op previously defining the output whole
    data.opSetInput(existop,in1.getWhole(),0);
    data.opSetInput(existop,in2.getWhole(),1);
  }
}